

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

bool __thiscall Analyzer::findFunctionReturnTypes(Analyzer *this,Node *node,uint *return_flags)

{
  bool bVar1;
  size_type sVar2;
  reference ppNVar3;
  Node *in_RDX;
  Analyzer *in_RSI;
  size_t i_2;
  bool allReturn;
  size_t i_1;
  bool retFound;
  size_t i;
  bool retElse;
  bool retThen;
  Node *val;
  bool local_61;
  ulong local_58;
  ulong local_48;
  ulong local_38;
  bool local_2a;
  uint *in_stack_ffffffffffffffd8;
  value_type pNVar4;
  bool local_1;
  
  if (*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
      == 0x2c) {
    sVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                      ((vector<Node_*,_std::allocator<Node_*>_> *)
                       &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_left);
    if (sVar2 == 0) {
      *(uint *)&(in_RDX->super_Poolable).ctx = *(uint *)&(in_RDX->super_Poolable).ctx | 1;
      local_1 = true;
    }
    else {
      ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                          ((vector<Node_*,_std::allocator<Node_*>_> *)
                           &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left,0);
      pNVar4 = *ppNVar3;
      if (pNVar4->nodeType == PNT_EXPRESSION_PAREN) {
        ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&pNVar4->children,0);
        pNVar4 = *ppNVar3;
      }
      if (pNVar4->nodeType == PNT_NULL) {
        *(uint *)&(in_RDX->super_Poolable).ctx = *(uint *)&(in_RDX->super_Poolable).ctx | 2;
      }
      else if (pNVar4->nodeType == PNT_BOOL) {
        *(uint *)&(in_RDX->super_Poolable).ctx = *(uint *)&(in_RDX->super_Poolable).ctx | 4;
      }
      else if ((pNVar4->nodeType == PNT_INTEGER) || (pNVar4->nodeType == PNT_FLOAT)) {
        *(uint *)&(in_RDX->super_Poolable).ctx = *(uint *)&(in_RDX->super_Poolable).ctx | 8;
      }
      else if ((pNVar4->nodeType == PNT_BINARY_OP) &&
              (((((pNVar4->tok->type == TK_EQ || (pNVar4->tok->type == TK_NE)) ||
                 ((pNVar4->tok->type == TK_GT ||
                  (((pNVar4->tok->type == TK_GE || (pNVar4->tok->type == TK_LS)) ||
                   (pNVar4->tok->type == TK_LE)))))) ||
                ((pNVar4->tok->type == TK_IN || (pNVar4->tok->type == TK_NOTIN)))) ||
               ((pNVar4->tok->type == TK_AND || (pNVar4->tok->type == TK_OR)))))) {
        *(uint *)&(in_RDX->super_Poolable).ctx = *(uint *)&(in_RDX->super_Poolable).ctx | 4;
      }
      else if ((pNVar4->nodeType == PNT_BINARY_OP) &&
              (((pNVar4->tok->type == TK_MINUS || (pNVar4->tok->type == TK_DIV)) ||
               ((pNVar4->tok->type == TK_MUL ||
                (((pNVar4->tok->type == TK_BITAND || (pNVar4->tok->type == TK_BITOR)) ||
                 (pNVar4->tok->type == TK_BITXOR)))))))) {
        *(uint *)&(in_RDX->super_Poolable).ctx = *(uint *)&(in_RDX->super_Poolable).ctx | 8;
      }
      else if ((pNVar4->nodeType == PNT_UNARY_PRE_OP) && (pNVar4->tok->type == TK_NOT)) {
        *(uint *)&(in_RDX->super_Poolable).ctx = *(uint *)&(in_RDX->super_Poolable).ctx | 4;
      }
      else if ((pNVar4->nodeType == PNT_UNARY_PRE_OP) &&
              ((pNVar4->tok->type == TK_MINUS || (pNVar4->tok->type == TK_INV)))) {
        *(uint *)&(in_RDX->super_Poolable).ctx = *(uint *)&(in_RDX->super_Poolable).ctx | 8;
      }
      else if (pNVar4->nodeType == PNT_STRING) {
        *(uint *)&(in_RDX->super_Poolable).ctx = *(uint *)&(in_RDX->super_Poolable).ctx | 0x10;
      }
      else if (pNVar4->nodeType == PNT_ARRAY_CREATION) {
        *(uint *)&(in_RDX->super_Poolable).ctx = *(uint *)&(in_RDX->super_Poolable).ctx | 0x40;
      }
      else if (pNVar4->nodeType == PNT_TABLE_CREATION) {
        *(uint *)&(in_RDX->super_Poolable).ctx = *(uint *)&(in_RDX->super_Poolable).ctx | 0x20;
      }
      else if (pNVar4->nodeType == PNT_LAMBDA) {
        *(uint *)&(in_RDX->super_Poolable).ctx = *(uint *)&(in_RDX->super_Poolable).ctx | 0x80;
      }
      else if (pNVar4->nodeType == PNT_FUNCTION_CALL) {
        *(uint *)&(in_RDX->super_Poolable).ctx = *(uint *)&(in_RDX->super_Poolable).ctx | 0x100;
      }
      else {
        *(uint *)&(in_RDX->super_Poolable).ctx = *(uint *)&(in_RDX->super_Poolable).ctx | 0x200;
      }
      local_1 = true;
    }
  }
  else if (*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent == 0x22) {
    std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
              ((vector<Node_*,_std::allocator<Node_*>_> *)
               &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,1
              );
    bVar1 = findFunctionReturnTypes(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    local_2a = false;
    sVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                      ((vector<Node_*,_std::allocator<Node_*>_> *)
                       &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_left);
    if (2 < sVar2) {
      std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                ((vector<Node_*,_std::allocator<Node_*>_> *)
                 &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                 ,2);
      local_2a = findFunctionReturnTypes(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
    }
    local_61 = false;
    if (bVar1) {
      local_61 = local_2a;
    }
    local_1 = local_61;
  }
  else if ((((*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_parent == 0x23) ||
            (*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_parent == 0x24)) ||
           (*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent == 0x26)) ||
          (*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent == 0x25)) {
    for (local_38 = 0;
        sVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                          ((vector<Node_*,_std::allocator<Node_*>_> *)
                           &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left), local_38 < sVar2; local_38 = local_38 + 1) {
      ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                          ((vector<Node_*,_std::allocator<Node_*>_> *)
                           &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left,local_38);
      if (*ppNVar3 != (value_type)0x0) {
        std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                  ((vector<Node_*,_std::allocator<Node_*>_> *)
                   &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left,local_38);
        findFunctionReturnTypes(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
      }
    }
    local_1 = false;
  }
  else if (*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent == 0x21) {
    local_1 = false;
    for (local_48 = 0;
        sVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                          ((vector<Node_*,_std::allocator<Node_*>_> *)
                           &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left), local_48 < sVar2; local_48 = local_48 + 1) {
      ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                          ((vector<Node_*,_std::allocator<Node_*>_> *)
                           &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left,local_48);
      if (*ppNVar3 != (value_type)0x0) {
        std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                  ((vector<Node_*,_std::allocator<Node_*>_> *)
                   &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left,local_48);
        bVar1 = findFunctionReturnTypes(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
        local_1 = local_1 != false || bVar1;
      }
    }
  }
  else if (*(int *)&(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent == 0x32) {
    local_1 = true;
    for (local_58 = 1;
        sVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                          ((vector<Node_*,_std::allocator<Node_*>_> *)
                           &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left), local_58 < sVar2; local_58 = local_58 + 1) {
      ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                          ((vector<Node_*,_std::allocator<Node_*>_> *)
                           &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                            _M_header._M_left,local_58);
      if (*ppNVar3 != (value_type)0x0) {
        ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                            ((vector<Node_*,_std::allocator<Node_*>_> *)
                             &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header.
                              _M_header._M_left,local_58);
        ppNVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&(*ppNVar3)->children,1);
        if (*ppNVar3 != (value_type)0x0) {
          std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                    ((vector<Node_*,_std::allocator<Node_*>_> *)
                     &(in_RSI->requiredModuleNames)._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_left,local_58);
          bVar1 = findFunctionReturnTypes(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
          local_1 = (local_1 & bVar1) != 0;
        }
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool findFunctionReturnTypes(Node * node, unsigned & return_flags)  // returns 'all ways return value'
  {
    if (node->nodeType == PNT_RETURN)
    {
      if (node->children.size() == 0)
      {
        return_flags |= RT_NOTHING;
        return true;
      }

      Node * val = node->children[0];
      if (val->nodeType == PNT_EXPRESSION_PAREN)
        val = val->children[0];

      if (val->nodeType == PNT_NULL)
        return_flags |= RT_NULL;
      else if (val->nodeType == PNT_BOOL)
        return_flags |= RT_BOOL;
      else if (val->nodeType == PNT_INTEGER || val->nodeType == PNT_FLOAT)
        return_flags |= RT_NUMBER;
      else if (val->nodeType == PNT_BINARY_OP && (
        val->tok.type == TK_EQ || val->tok.type == TK_NE || val->tok.type == TK_GT || val->tok.type == TK_GE ||
        val->tok.type == TK_LS || val->tok.type == TK_LE || val->tok.type == TK_IN || val->tok.type == TK_NOTIN ||
        val->tok.type == TK_AND ||
        val->tok.type == TK_OR))
      {
        return_flags |= RT_BOOL;
      }
      else if (val->nodeType == PNT_BINARY_OP && (val->tok.type == TK_MINUS || val->tok.type == TK_DIV ||
        val->tok.type == TK_MUL || val->tok.type == TK_BITAND || val->tok.type == TK_BITOR || val->tok.type == TK_BITXOR))
      {
        return_flags |= RT_NUMBER;
      }
      else if (val->nodeType == PNT_UNARY_PRE_OP && (val->tok.type == TK_NOT))
        return_flags |= RT_BOOL;
      else if (val->nodeType == PNT_UNARY_PRE_OP && (val->tok.type == TK_MINUS || val->tok.type == TK_INV))
        return_flags |= RT_NUMBER;
      else if (val->nodeType == PNT_STRING)
        return_flags |= RT_STRING;
      else if (val->nodeType == PNT_ARRAY_CREATION)
        return_flags |= RT_ARRAY;
      else if (val->nodeType == PNT_TABLE_CREATION)
        return_flags |= RT_TABLE;
      else if (val->nodeType == PNT_LAMBDA)
        return_flags |= RT_CLOSURE;
      else if (val->nodeType == PNT_FUNCTION_CALL)
        return_flags |= RT_FUNCTION_CALL;
      else
        return_flags |= RT_UNRECOGNIZED;

      return true;
    }
    else if (node->nodeType == PNT_IF_ELSE)
    {
      bool retThen = findFunctionReturnTypes(node->children[1], return_flags);
      bool retElse = false;
      if (node->children.size() > 2)
        retElse = findFunctionReturnTypes(node->children[2], return_flags);
      return retThen && retElse;
    }
    else if (node->nodeType == PNT_WHILE_LOOP || node->nodeType == PNT_DO_WHILE_LOOP || node->nodeType == PNT_FOR_EACH_LOOP ||
      node->nodeType == PNT_FOR_LOOP)
    {
      for (size_t i = 0; i < node->children.size(); i++)
        if (node->children[i])
          (void)findFunctionReturnTypes(node->children[i], return_flags);
      return false;
    }
    else if (node->nodeType == PNT_STATEMENT_LIST)
    {
      bool retFound = false;
      for (size_t i = 0; i < node->children.size(); i++)
        if (node->children[i])
          retFound |= findFunctionReturnTypes(node->children[i], return_flags);
      return retFound;
    }
    else if (node->nodeType == PNT_SWITCH_STATEMENT)
    {
      bool allReturn = true;
      for (size_t i = 1; i < node->children.size(); i++)
        if (node->children[i] && node->children[i]->children[1])
          allReturn &= findFunctionReturnTypes(node->children[i], return_flags);
      return allReturn;
    }

    return false;
  }